

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_
          (string *__return_storage_ptr__,cmComputeLinkInformation *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  allocator local_19;
  cmComputeLinkInformation *local_18;
  cmComputeLinkInformation *this_local;
  
  local_18 = this;
  this_local = (cmComputeLinkInformation *)__return_storage_ptr__;
  if (this->OrderDependentRPath == (cmOrderDirectories *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    r = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderDependentRPath);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (__return_storage_ptr__,r,":");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::GetRPathLinkString()
{
  // If there is no separate linker runtime search flag (-rpath-link)
  // there is no reason to compute a string.
  if (!this->OrderDependentRPath) {
    return "";
  }

  // Construct the linker runtime search path.
  return cmJoin(this->OrderDependentRPath->GetOrderedDirectories(), ":");
}